

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_xtc_reset(llama_sampler *smpl)

{
  llama_sampler_context_t pvVar1;
  uint32_t uVar2;
  
  pvVar1 = smpl->ctx;
  uVar2 = get_rng_seed(*(uint32_t *)((long)pvVar1 + 0x10));
  *(uint32_t *)((long)pvVar1 + 0x14) = uVar2;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)((long)pvVar1 + 0x18),(ulong)uVar2);
  return;
}

Assistant:

static void llama_sampler_xtc_reset(struct llama_sampler * smpl) {
    auto * ctx = (llama_sampler_xtc *) smpl->ctx;
    ctx->seed_cur = get_rng_seed(ctx->seed);
    ctx->rng.seed(ctx->seed_cur);
}